

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O1

void __thiscall
cmCMakePresetsGraph::ConfigurePreset::ConfigurePreset
          (ConfigurePreset *this,ConfigurePreset *param_1)

{
  pointer pcVar1;
  optional<bool> oVar2;
  optional<bool> oVar3;
  optional<bool> oVar4;
  optional<bool> oVar5;
  optional<bool> oVar6;
  optional<bool> oVar7;
  optional<bool> oVar8;
  
  Preset::Preset(&this->super_Preset,&param_1->super_Preset);
  (this->super_Preset)._vptr_Preset = (_func_int **)&PTR__ConfigurePreset_009bb8b8;
  (this->Generator)._M_dataplus._M_p = (pointer)&(this->Generator).field_2;
  pcVar1 = (param_1->Generator)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Generator,pcVar1,pcVar1 + (param_1->Generator)._M_string_length);
  (this->Architecture)._M_dataplus._M_p = (pointer)&(this->Architecture).field_2;
  pcVar1 = (param_1->Architecture)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Architecture,pcVar1,pcVar1 + (param_1->Architecture)._M_string_length)
  ;
  (this->ArchitectureStrategy).
  super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>._M_payload.
  super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy> =
       (param_1->ArchitectureStrategy).
       super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>._M_payload.
       super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy>;
  (this->Toolset)._M_dataplus._M_p = (pointer)&(this->Toolset).field_2;
  pcVar1 = (param_1->Toolset)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Toolset,pcVar1,pcVar1 + (param_1->Toolset)._M_string_length);
  (this->ToolsetStrategy).super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>
  ._M_payload.super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy> =
       (param_1->ToolsetStrategy).
       super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>._M_payload.
       super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy>;
  (this->ToolchainFile)._M_dataplus._M_p = (pointer)&(this->ToolchainFile).field_2;
  pcVar1 = (param_1->ToolchainFile)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ToolchainFile,pcVar1,
             pcVar1 + (param_1->ToolchainFile)._M_string_length);
  (this->BinaryDir)._M_dataplus._M_p = (pointer)&(this->BinaryDir).field_2;
  pcVar1 = (param_1->BinaryDir)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->BinaryDir,pcVar1,pcVar1 + (param_1->BinaryDir)._M_string_length);
  (this->InstallDir)._M_dataplus._M_p = (pointer)&(this->InstallDir).field_2;
  pcVar1 = (param_1->InstallDir)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->InstallDir,pcVar1,pcVar1 + (param_1->InstallDir)._M_string_length);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
  ::_Rb_tree(&(this->CacheVariables)._M_t,&(param_1->CacheVariables)._M_t);
  oVar2.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->DebugFind).super__Optional_base<bool,_true,_true>;
  this->DebugTryCompile =
       (_Optional_base<bool,_true,_true>)
       (param_1->DebugTryCompile).super__Optional_base<bool,_true,_true>;
  this->DebugFind =
       (optional<bool>)
       oVar2.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  oVar2.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->ErrorDev).super__Optional_base<bool,_true,_true>;
  oVar3.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->WarnDeprecated).super__Optional_base<bool,_true,_true>;
  oVar4.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->ErrorDeprecated).super__Optional_base<bool,_true,_true>;
  oVar5.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->WarnUninitialized).super__Optional_base<bool,_true,_true>;
  oVar6.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->WarnUnusedCli).super__Optional_base<bool,_true,_true>;
  oVar7.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->WarnSystemVars).super__Optional_base<bool,_true,_true>;
  oVar8.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool> =
       (param_1->DebugOutput).super__Optional_base<bool,_true,_true>;
  this->WarnDev =
       (_Optional_base<bool,_true,_true>)(param_1->WarnDev).super__Optional_base<bool,_true,_true>;
  this->ErrorDev =
       (optional<bool>)
       oVar2.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  this->WarnDeprecated =
       (optional<bool>)
       oVar3.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  this->ErrorDeprecated =
       (optional<bool>)
       oVar4.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  this->WarnUninitialized =
       (optional<bool>)
       oVar5.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  this->WarnUnusedCli =
       (optional<bool>)
       oVar6.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  this->WarnSystemVars =
       (optional<bool>)
       oVar7.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  this->DebugOutput =
       (optional<bool>)
       oVar8.super__Optional_base<bool,_true,_true>._M_payload.super__Optional_payload_base<bool>;
  return;
}

Assistant:

ConfigurePreset(const ConfigurePreset& /*other*/) = default;